

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O1

int xmlShellList(xmlShellCtxtPtr ctxt,char *arg,xmlNodePtr node,xmlNodePtr node2)

{
  xmlElementType xVar1;
  _xmlNode *node_00;
  
  if (ctxt == (xmlShellCtxtPtr)0x0) {
    return 0;
  }
  if (node == (xmlNodePtr)0x0) {
    fwrite("NULL\n",5,1,(FILE *)ctxt->output);
    return 0;
  }
  xVar1 = node->type;
  if (xVar1 != XML_DOCUMENT_NODE) {
    if (xVar1 == XML_NAMESPACE_DECL) {
LAB_0013f004:
      xmlLsOneNode(ctxt->output,node);
      return 0;
    }
    if (xVar1 != XML_HTML_DOCUMENT_NODE) {
      node_00 = node->children;
      if (node_00 == (_xmlNode *)0x0) goto LAB_0013f004;
      goto LAB_0013f022;
    }
  }
  node_00 = node->children;
LAB_0013f022:
  for (; node_00 != (xmlNodePtr)0x0; node_00 = node_00->next) {
    xmlLsOneNode(ctxt->output,node_00);
  }
  return 0;
}

Assistant:

int
xmlShellList(xmlShellCtxtPtr ctxt,
             char *arg ATTRIBUTE_UNUSED, xmlNodePtr node,
             xmlNodePtr node2 ATTRIBUTE_UNUSED)
{
    xmlNodePtr cur;
    if (!ctxt)
        return (0);
    if (node == NULL) {
	fprintf(ctxt->output, "NULL\n");
	return (0);
    }
    if ((node->type == XML_DOCUMENT_NODE) ||
        (node->type == XML_HTML_DOCUMENT_NODE)) {
        cur = ((xmlDocPtr) node)->children;
    } else if (node->type == XML_NAMESPACE_DECL) {
        xmlLsOneNode(ctxt->output, node);
        return (0);
    } else if (node->children != NULL) {
        cur = node->children;
    } else {
        xmlLsOneNode(ctxt->output, node);
        return (0);
    }
    while (cur != NULL) {
        xmlLsOneNode(ctxt->output, cur);
        cur = cur->next;
    }
    return (0);
}